

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fadop.h
# Opt level: O3

value_type __thiscall
FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_FadExpr<FadFuncSin<FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_FadCst<double>_>_>_>_>_>
::fastAccessDx(FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_FadExpr<FadFuncSin<FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_FadCst<double>_>_>_>_>_>
               *this,int i)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_> *pFVar6;
  Fad<double> *pFVar7;
  double dVar8;
  double dVar9;
  
  dVar1 = (((this->left_->fadexpr_).right_)->dx_).ptr_to_data[i];
  dVar2 = (this->left_->fadexpr_).left_.constant_;
  pFVar6 = (this->right_->fadexpr_).expr_.fadexpr_.left_;
  dVar8 = sin(((pFVar6->fadexpr_).left_.constant_ * ((pFVar6->fadexpr_).right_)->val_) /
              (this->right_->fadexpr_).expr_.fadexpr_.right_.constant_);
  pFVar6 = (this->right_->fadexpr_).expr_.fadexpr_.left_;
  pFVar7 = (pFVar6->fadexpr_).right_;
  dVar3 = (pFVar6->fadexpr_).left_.constant_;
  dVar4 = (pFVar7->dx_).ptr_to_data[i];
  dVar5 = (this->right_->fadexpr_).expr_.fadexpr_.right_.constant_;
  dVar9 = cos((dVar3 * pFVar7->val_) / dVar5);
  return dVar9 * ((dVar4 * dVar3) / dVar5) *
         (this->left_->fadexpr_).left_.constant_ * ((this->left_->fadexpr_).right_)->val_ +
         dVar8 * dVar1 * dVar2;
}

Assistant:

value_type fastAccessDx(int i) const { return left_.fastAccessDx(i) * right_.val() + right_.fastAccessDx(i) * left_.val();}